

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O2

void tcu::decompress(PixelBufferAccess *dst,CompressedTexFormat fmt,deUint8 *src,
                    TexDecompressionParams *params)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  deUint64 dVar8;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  int height;
  int iVar15;
  int iVar16;
  deUint8 *data;
  ulong uVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int depth;
  int iVar24;
  byte local_12c [4];
  int local_128;
  int local_124;
  CompressedTexFormat local_120;
  IVec3 blockPos;
  byte local_10c;
  IVec3 blockPixelSize;
  PixelBufferAccess blockAccess;
  IVec3 dstPixelPos;
  IVec3 blockPitches;
  deUint32 table [2];
  int local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedBlock;
  EVP_PKEY_CTX local_58;
  byte local_57;
  
  iVar6 = getBlockSize(fmt);
  getBlockPixelSize((tcu *)&blockPixelSize,fmt);
  iVar7 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar24 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar15 = (iVar7 / blockPixelSize.m_data[0] + 1) - (uint)(iVar7 % blockPixelSize.m_data[0] == 0);
  iVar24 = (iVar24 / blockPixelSize.m_data[1] + 1) - (uint)(iVar24 % blockPixelSize.m_data[1] == 0);
  local_128 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
  local_124 = blockPixelSize.m_data[2];
  blockPitches.m_data[1] = iVar15 * iVar6;
  blockPitches.m_data[2] = iVar24 * blockPitches.m_data[1];
  blockPitches.m_data[0] = iVar6;
  iVar7 = TextureFormat::getPixelSize((TextureFormat *)dst);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&uncompressedBlock,
             (long)(iVar7 * blockPixelSize.m_data[0] * blockPixelSize.m_data[1] *
                   blockPixelSize.m_data[2]),(allocator_type *)&blockAccess);
  local_120 = fmt;
  table = (deUint32  [2])getUncompressedFormat(fmt);
  PixelBufferAccess::PixelBufferAccess
            (&blockAccess,(TextureFormat *)table,blockPixelSize.m_data[0],blockPixelSize.m_data[1],
             blockPixelSize.m_data[2],
             uncompressedBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start);
  iVar7 = (local_128 / local_124 + 1) - (uint)(local_128 % local_124 == 0);
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  if (iVar24 < 1) {
    iVar24 = 0;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  iVar6 = 0;
  do {
    if (iVar6 == iVar7) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&uncompressedBlock.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    for (local_128 = 0; local_128 != iVar24; local_128 = local_128 + 1) {
      iVar23 = 0;
      while (iVar23 != iVar15) {
        blockPos.m_data[1] = local_128;
        local_124 = iVar23;
        blockPos.m_data[0] = iVar23;
        blockPos.m_data[2] = iVar6;
        operator*((tcu *)table,&blockPos,&blockPitches);
        iVar16 = table[1] + table[0];
        iVar23 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0] -
                 blockPos.m_data[0] * blockPixelSize.m_data[0];
        if (blockPixelSize.m_data[0] < iVar23) {
          iVar23 = blockPixelSize.m_data[0];
        }
        height = (dst->super_ConstPixelBufferAccess).m_size.m_data[1] -
                 blockPos.m_data[1] * blockPixelSize.m_data[1];
        if (blockPixelSize.m_data[1] < height) {
          height = blockPixelSize.m_data[1];
        }
        depth = (dst->super_ConstPixelBufferAccess).m_size.m_data[2] -
                blockPos.m_data[2] * blockPixelSize.m_data[2];
        if (blockPixelSize.m_data[2] < depth) {
          depth = blockPixelSize.m_data[2];
        }
        operator*((tcu *)&dstPixelPos,&blockPos,&blockPixelSize);
        pvVar5 = blockAccess.super_ConstPixelBufferAccess.m_data;
        if (COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8 < local_120) goto LAB_00556ccd;
        data = src + (iVar16 + local_90);
        switch(local_120) {
        case COMPRESSEDTEXFORMAT_ETC1_RGB8:
          dVar8 = anon_unknown_0::EtcDecompressInternal::get64BitBlock(data,0);
          uVar1 = (uint)(dVar8 >> 0x20);
          table = (deUint32  [2])(CONCAT44(uVar1 >> 2,uVar1 >> 5) & 0x700000007);
          bVar18 = (byte)(dVar8 >> 0x28);
          bVar20 = (byte)(dVar8 >> 0x30);
          bVar13 = (byte)(dVar8 >> 0x38);
          if ((dVar8 >> 0x21 & 1) == 0) {
            local_58 = (EVP_PKEY_CTX)((bVar13 >> 4) * '\x11');
            local_57 = (bVar13 & 0xf) * '\x11';
            local_12c[2] = ((byte)(dVar8 >> 0x34) & 0xf) * '\x11';
            local_12c[3] = (bVar20 & 0xf) * '\x11';
            local_12c[0] = ((byte)(dVar8 >> 0x2c) & 0xf) * '\x11';
            local_12c[1] = (bVar18 & 0xf) * '\x11';
          }
          else {
            bVar2 = (byte)(dVar8 >> 0x33);
            bVar12 = bVar2 & 0x1f;
            bVar3 = (byte)(dVar8 >> 0x2b);
            bVar19 = bVar3 & 0x1f;
            local_10c = bVar13 & 0xf8;
            bVar9 = ((char)(bVar13 << 5) >> 7 & 0xf8U) + (bVar13 & 7) + (bVar13 >> 3);
            local_58 = (EVP_PKEY_CTX)((bVar13 >> 5) + local_10c);
            bVar13 = ((char)(bVar20 << 5) >> 7 & 0xf8U) + (bVar20 & 7) + bVar12;
            local_12c[2] = bVar12 >> 2 | bVar2 << 3;
            bVar20 = ((char)(bVar18 << 5) >> 7 & 0xf8U | bVar18 & 7) + bVar19;
            local_12c[0] = bVar19 >> 2 | bVar3 << 3;
            local_57 = bVar9 >> 2 | bVar9 * '\b';
            local_12c[3] = bVar13 >> 2 | bVar13 * '\b';
            local_12c[1] = bVar20 >> 2 | bVar20 * '\b';
          }
          for (uVar14 = 0; uVar14 != 0x10; uVar14 = uVar14 + 1) {
            uVar1 = (uint)(uVar14 >> 2) & 0x3fffffff;
            uVar21 = (uint)uVar14 & 3;
            uVar10 = uVar21;
            if ((dVar8 >> 0x20 & 1) == 0) {
              uVar10 = uVar1;
            }
            uVar17 = (ulong)(1 < uVar10);
            iVar16 = anon_unknown_0::EtcDecompressInternal::decompressETC2Block::modifierTable
                     [table[uVar17]]
                     [(uint)((dVar8 >> (uVar14 & 0x3f) & 1) != 0) +
                      ((uint)(dVar8 >> ((char)uVar14 + 0x10U & 0x3f)) & 1) * 2];
            iVar22 = (uint)(byte)(&local_58)[uVar17] + iVar16;
            if (0xfe < iVar22) {
              iVar22 = 0xff;
            }
            if (iVar22 < 1) {
              iVar22 = 0;
            }
            lVar4 = (ulong)(uVar1 + uVar21 * 4) * 3;
            *(char *)((long)pvVar5 + lVar4) = (char)iVar22;
            iVar22 = (uint)local_12c[uVar17 + 2] + iVar16;
            if (0xfe < iVar22) {
              iVar22 = 0xff;
            }
            if (iVar22 < 1) {
              iVar22 = 0;
            }
            *(char *)((long)pvVar5 + lVar4 + 1) = (char)iVar22;
            iVar16 = iVar16 + (uint)local_12c[uVar17];
            if (0xfe < iVar16) {
              iVar16 = 0xff;
            }
            if (iVar16 < 1) {
              iVar16 = 0;
            }
            *(char *)((long)pvVar5 + lVar4 + 2) = (char)iVar16;
          }
          break;
        case COMPRESSEDTEXFORMAT_EAC_R11:
          bVar11 = false;
          goto LAB_00556e0e;
        case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
          bVar11 = true;
LAB_00556e0e:
          anon_unknown_0::decompressEAC_R11(&blockAccess,data,bVar11);
          break;
        case COMPRESSEDTEXFORMAT_EAC_RG11:
          bVar11 = false;
          goto LAB_00556d57;
        case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
          bVar11 = true;
LAB_00556d57:
          anon_unknown_0::decompressEAC_RG11(&blockAccess,data,bVar11);
          break;
        case COMPRESSEDTEXFORMAT_ETC2_RGB8:
        case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
          anon_unknown_0::decompressETC2(&blockAccess,data);
          break;
        case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
        case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
          anon_unknown_0::decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1(&blockAccess,data);
          break;
        case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
        case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
          anon_unknown_0::decompressETC2_EAC_RGBA8(&blockAccess,data);
          break;
        default:
          astc::decompress(&blockAccess,data,local_120,params->astcMode);
        }
LAB_00556ccd:
        getSubregion((PixelBufferAccess *)table,dst,dstPixelPos.m_data[0],dstPixelPos.m_data[1],
                     dstPixelPos.m_data[2],iVar23,height,depth);
        getSubregion((PixelBufferAccess *)&local_58,&blockAccess,0,0,0,iVar23,height,depth);
        copy((EVP_PKEY_CTX *)table,&local_58);
        iVar23 = local_124 + 1;
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void decompress (const PixelBufferAccess& dst, CompressedTexFormat fmt, const deUint8* src, const TexDecompressionParams& params)
{
	const int				blockSize			= getBlockSize(fmt);
	const IVec3				blockPixelSize		(getBlockPixelSize(fmt));
	const IVec3				blockCount			(deDivRoundUp32(dst.getWidth(),		blockPixelSize.x()),
												 deDivRoundUp32(dst.getHeight(),	blockPixelSize.y()),
												 deDivRoundUp32(dst.getDepth(),		blockPixelSize.z()));
	const IVec3				blockPitches		(blockSize, blockSize * blockCount.x(), blockSize * blockCount.x() * blockCount.y());

	std::vector<deUint8>	uncompressedBlock	(dst.getFormat().getPixelSize() * blockPixelSize.x() * blockPixelSize.y() * blockPixelSize.z());
	const PixelBufferAccess	blockAccess			(getUncompressedFormat(fmt), blockPixelSize.x(), blockPixelSize.y(), blockPixelSize.z(), &uncompressedBlock[0]);

	DE_ASSERT(dst.getFormat() == getUncompressedFormat(fmt));

	for (int blockZ = 0; blockZ < blockCount.z(); blockZ++)
	for (int blockY = 0; blockY < blockCount.y(); blockY++)
	for (int blockX = 0; blockX < blockCount.x(); blockX++)
	{
		const IVec3				blockPos	(blockX, blockY, blockZ);
		const deUint8* const	blockPtr	= src + componentSum(blockPos * blockPitches);
		const IVec3				copySize	(de::min(blockPixelSize.x(), dst.getWidth()		- blockPos.x() * blockPixelSize.x()),
											 de::min(blockPixelSize.y(), dst.getHeight()	- blockPos.y() * blockPixelSize.y()),
											 de::min(blockPixelSize.z(), dst.getDepth()		- blockPos.z() * blockPixelSize.z()));
		const IVec3				dstPixelPos	= blockPos * blockPixelSize;

		decompressBlock(fmt, blockAccess, blockPtr, params);

		copy(getSubregion(dst, dstPixelPos.x(), dstPixelPos.y(), dstPixelPos.z(), copySize.x(), copySize.y(), copySize.z()), getSubregion(blockAccess, 0, 0, 0, copySize.x(), copySize.y(), copySize.z()));
	}
}